

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asp_preprocessor.cpp
# Opt level: O0

ValueRep __thiscall Clasp::Asp::Preprocessor::simplifyHead(Preprocessor *this,PrgHead *h,bool more)

{
  bool bVar1;
  ValueRep VVar2;
  ValueRep VVar3;
  uint32 uVar4;
  Var VVar5;
  int iVar6;
  sup_iterator pPVar7;
  reference pPVar8;
  iterator this_00;
  iterator pPVar9;
  PrgBody *pPVar10;
  size_t *siglen;
  byte in_DL;
  uchar *sig;
  PrgHead *in_RSI;
  EVP_PKEY_CTX *ctx;
  undefined8 *in_RDI;
  uchar *tbs;
  size_t in_R9;
  PrgBody *B;
  EdgeIterator end;
  EdgeIterator it;
  EdgeVec temp;
  PrgBody *supBody;
  uint32 numSuppLits;
  PrgEdge support;
  ValueRep ret;
  ValueRep v;
  PrgBody *in_stack_fffffffffffffeb8;
  undefined1 uVar11;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  undefined8 in_stack_fffffffffffffec8;
  ValueRep v_00;
  PrgHead *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  PrgBody *in_stack_fffffffffffffee0;
  PrgEdge *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  PrgHead *in_stack_ffffffffffffff00;
  EdgeType t;
  undefined4 in_stack_ffffffffffffff08;
  Type in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  Literal in_stack_ffffffffffffff14;
  byte local_e2;
  undefined8 in_stack_ffffffffffffff58;
  undefined1 backprop;
  LogicProgram *in_stack_ffffffffffffff60;
  PrgBody *this_01;
  Literal local_7c;
  uint32 *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  LogicProgram *in_stack_ffffffffffffff98;
  PrgHead *in_stack_ffffffffffffffa0;
  undefined1 local_49 [17];
  uint32 local_38;
  uint32 local_34;
  PrgBody *local_30;
  int local_24;
  PrgEdge local_20;
  ValueRep local_1b;
  ValueRep local_1a;
  byte local_19;
  PrgHead *local_18;
  ValueRep local_1;
  
  backprop = (undefined1)((ulong)in_stack_ffffffffffffff58 >> 0x38);
  v_00 = (ValueRep)((ulong)in_stack_fffffffffffffec8 >> 0x38);
  uVar11 = (undefined1)((ulong)in_stack_ffffffffffffff90 >> 0x38);
  local_19 = in_DL & 1;
  local_18 = in_RSI;
  bVar1 = PrgNode::hasVar(&in_RSI->super_PrgNode);
  if ((bVar1) && (bVar1 = PrgNode::relevant(&local_18->super_PrgNode), bVar1)) {
    local_1a = PrgNode::value(&local_18->super_PrgNode);
    local_1b = '\x01';
    uVar4 = PrgHead::supports((PrgHead *)0x225c64);
    if (uVar4 == 0) {
      local_20 = PrgEdge::noEdge();
    }
    else {
      pPVar7 = PrgHead::supps_begin((PrgHead *)0x225c76);
      local_20.rep = pPVar7->rep;
    }
    local_24 = 0;
    bVar1 = PrgHead::simplifySupports
                      (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(bool)uVar11,
                       in_stack_ffffffffffffff88);
    VVar3 = local_1a;
    if (bVar1) {
      VVar2 = PrgNode::value(&local_18->super_PrgNode);
      if ((VVar3 != VVar2) &&
         ((VVar3 = PrgNode::value(&local_18->super_PrgNode), VVar3 == '\x02' ||
          ((VVar3 = PrgNode::value(&local_18->super_PrgNode), VVar3 == '\x01' &&
           (VVar5 = PrgNode::var(&local_18->super_PrgNode), VVar5 != 0)))))) {
        local_1b = '\x03';
      }
      if ((local_19 & 1) != 0) {
        if ((local_24 == 0) && (bVar1 = PrgNode::hasVar(&local_18->super_PrgNode), bVar1)) {
          local_1b = '\x03';
        }
        else {
          uVar4 = PrgHead::supports((PrgHead *)0x225d83);
          if ((uVar4 == 0) ||
             (pPVar7 = PrgHead::supps_begin((PrgHead *)0x225d95), pPVar7->rep == local_20.rep)) {
            bVar1 = PrgEdge::isNormal(&local_20);
            if (((bVar1) && (uVar4 = PrgHead::supports((PrgHead *)0x225dcd), uVar4 == 1)) ||
               ((uVar4 = PrgHead::supports((PrgHead *)0x225ddf), 1 < uVar4 &&
                ((local_24 == 1 && (bVar1 = PrgHead::isAtom(local_18), bVar1)))))) {
              this_01 = (PrgBody *)*in_RDI;
              PrgEdge::node(&local_20);
              local_30 = LogicProgram::getBody
                                   ((LogicProgram *)
                                    CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                                    (Id_t)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
              local_34 = (uint32)PrgNode::literal(&in_stack_fffffffffffffeb8->super_PrgNode);
              local_38 = (uint32)PrgNode::literal(&in_stack_fffffffffffffeb8->super_PrgNode);
              bVar1 = Clasp::operator!=((Literal *)
                                        CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0
                                                ),(Literal *)in_stack_fffffffffffffeb8);
              if (bVar1) {
                uVar4 = PrgHead::supports((PrgHead *)0x225e96);
                if (1 < uVar4) {
                  PrgHead::supps_begin((PrgHead *)0x225eac);
                  pPVar7 = PrgHead::supps_end((PrgHead *)0x225ec1);
                  in_stack_ffffffffffffff60 = (LogicProgram *)local_49;
                  std::allocator<Clasp::Asp::PrgEdge>::allocator
                            ((allocator<Clasp::Asp::PrgEdge> *)0x225ede);
                  tbs = (uchar *)0x0;
                  bk_lib::pod_vector<Clasp::Asp::PrgEdge,std::allocator<Clasp::Asp::PrgEdge>>::
                  pod_vector<Clasp::Asp::PrgEdge_const*>
                            ((pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>
                              *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                             in_stack_fffffffffffffee8,(PrgEdge *)in_stack_fffffffffffffee0,
                             (allocator_type *)
                             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                             (type_conflict *)in_stack_fffffffffffffed0);
                  std::allocator<Clasp::Asp::PrgEdge>::~allocator
                            ((allocator<Clasp::Asp::PrgEdge> *)0x225f17);
                  PrgHead::clearSupports
                            ((PrgHead *)
                             CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
                  pPVar8 = bk_lib::
                           pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>::
                           operator[]((pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>
                                       *)(local_49 + 1),0);
                  local_20.rep = pPVar8->rep;
                  this_00 = bk_lib::
                            pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>::
                            begin((pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>
                                   *)(local_49 + 1));
                  pPVar9 = bk_lib::
                           pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>::
                           end((pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>
                                *)(local_49 + 1));
                  while( true ) {
                    backprop = (undefined1)((ulong)pPVar7 >> 0x38);
                    t = (EdgeType)((ulong)in_stack_ffffffffffffff00 >> 0x20);
                    if (this_00 == pPVar9) break;
                    PrgEdge::node(this_00);
                    pPVar10 = LogicProgram::getBody
                                        ((LogicProgram *)
                                         CONCAT17(in_stack_fffffffffffffec7,
                                                  in_stack_fffffffffffffec0),
                                         (Id_t)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
                    bVar1 = PrgEdge::isNormal(this_00);
                    local_e2 = 0;
                    if (bVar1) {
                      uVar4 = PrgBody::size(pPVar10);
                      siglen = (size_t *)(ulong)uVar4;
                      local_e2 = 0;
                      if (uVar4 == 1) {
                        ctx = (EVP_PKEY_CTX *)0x0;
                        in_stack_ffffffffffffff14 = PrgBody::goal(in_stack_fffffffffffffeb8,0);
                        local_7c = in_stack_ffffffffffffff14;
                        iVar6 = Literal::sign(&local_7c,ctx,sig,siglen,tbs,in_R9);
                        local_e2 = (byte)iVar6;
                        in_stack_ffffffffffffff10 =
                             CONCAT13(local_e2,(int3)in_stack_ffffffffffffff10);
                      }
                    }
                    if ((local_e2 & 1) != 0) {
                      local_20.rep = this_00->rep;
                    }
                    in_stack_ffffffffffffff00 = local_18;
                    in_stack_ffffffffffffff0c = PrgEdge::type(this_00);
                    PrgBody::removeHead(in_stack_fffffffffffffee0,
                                        (PrgHead *)
                                        CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8
                                                ),
                                        (EdgeType)((ulong)in_stack_fffffffffffffed0 >> 0x20));
                    this_00 = this_00 + 1;
                  }
                  PrgEdge::node(&local_20);
                  pPVar10 = LogicProgram::getBody
                                      ((LogicProgram *)
                                       CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0)
                                       ,(Id_t)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
                  uVar11 = (undefined1)((ulong)in_stack_fffffffffffffeb8 >> 0x38);
                  in_stack_fffffffffffffed0 = local_18;
                  local_30 = pPVar10;
                  PrgEdge::type(&local_20);
                  PrgBody::addHead((PrgBody *)
                                   CONCAT44(in_stack_ffffffffffffff14.rep_,in_stack_ffffffffffffff10
                                           ),
                                   (PrgHead *)
                                   CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),t);
                  bVar1 = PrgBody::simplifyHeads
                                    (pPVar10,(LogicProgram *)
                                             CONCAT17(in_stack_fffffffffffffec7,
                                                      in_stack_fffffffffffffec0),(bool)uVar11);
                  v_00 = (ValueRep)((ulong)pPVar10 >> 0x38);
                  if (!bVar1) {
                    local_1 = '\x02';
                  }
                  bk_lib::pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>::
                  ~pod_vector((pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>
                               *)0x226223);
                  if (!bVar1) {
                    return local_1;
                  }
                }
                local_1b = '\x03';
                VVar3 = PrgNode::value(&local_18->super_PrgNode);
                if ((VVar3 == '\x03') ||
                   (VVar3 = PrgNode::value(&local_18->super_PrgNode), VVar3 == '\x01')) {
                  PrgNode::value(&local_18->super_PrgNode);
                  PrgBody::assignValue((PrgBody *)in_stack_fffffffffffffed0,v_00);
                  PrgBody::propagateValue(this_01,in_stack_ffffffffffffff60,(bool)backprop);
                }
              }
            }
          }
          else {
            local_1b = '\x03';
          }
        }
      }
      local_1 = local_1b;
    }
    else {
      local_1 = '\x02';
    }
  }
  else {
    PrgNode::clearLiteral(&local_18->super_PrgNode,false);
    PrgNode::markRemoved((PrgNode *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    PrgHead::clearSupports((PrgHead *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0))
    ;
    PrgHead::setInUpper(local_18,false);
    local_1 = '\x01';
  }
  return local_1;
}

Assistant:

ValueRep Preprocessor::simplifyHead(PrgHead* h, bool more) {
	if (!h->hasVar() || !h->relevant()) {
		// unsupported or eq
		h->clearLiteral(false);
		h->markRemoved();
		h->clearSupports();
		h->setInUpper(false);
		return value_true;
	}
	assert(h->inUpper());
	ValueRep v       = h->value();
	ValueRep ret     = value_true;
	PrgEdge support  = h->supports() ? *h->supps_begin() : PrgEdge::noEdge();
	uint32 numSuppLits= 0;
	if (!h->simplifySupports(*prg_, true, &numSuppLits)) {
		return value_false;
	}
	if (v != h->value() && (h->value() == value_false || (h->value() == value_true && h->var() != 0))) {
		ret = value_weak_true;
	}
	if (more) {
		if (numSuppLits == 0 && h->hasVar()) {
			// unsupported head does not need a variable
			ret = value_weak_true;
		}
		else if (h->supports() > 0 && h->supps_begin()->rep != support.rep) {
			// support for head has changed
			ret = value_weak_true;
		}
		else if ((support.isNormal() && h->supports() == 1) || (h->supports() > 1 && numSuppLits == 1 && h->isAtom())) {
			assert(support.isBody());
			PrgBody* supBody = prg_->getBody(support.node());
			if (supBody->literal() != h->literal()) {
				if (h->supports() > 1) {
					// atom is equivalent to one of its bodies
					EdgeVec temp(h->supps_begin(), h->supps_end());
					h->clearSupports();
					support = temp[0];
					for (EdgeIterator it = temp.begin(), end = temp.end(); it != end; ++it) {
						assert(!it->isDisj());
						PrgBody* B = prg_->getBody(it->node());
						if (it->isNormal() && B->size() == 1 && B->goal(0).sign()) {
							support = *it;
						}
						B->removeHead(h, it->type());
					}
					supBody = prg_->getBody(support.node());
					supBody->addHead(h, support.type());
					if (!supBody->simplifyHeads(*prg_, true)) {
						return value_false;
					}
				}
				ret = value_weak_true;
				if (h->value() == value_weak_true || h->value() == value_true) {
					supBody->assignValue(h->value());
					supBody->propagateValue(*prg_, true);
				}
			}
		}
	}
	return ret;
}